

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

value_type * __thiscall
poplar::
map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>::
update(map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
       *this,char_range key)

{
  uint32_t uVar1;
  bool bVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  type *ppiVar5;
  type_conflict *ptVar6;
  reference pvVar7;
  value_type_conflict7 *pvVar8;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
  *in_RDI;
  pair<const_int_*,_unsigned_long> pVar9;
  int *vptr;
  type_conflict *match;
  type *vptr_1;
  uint64_t node_id;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
  *in_stack_fffffffffffffd58;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
  *in_stack_fffffffffffffd60;
  uint64_t in_stack_fffffffffffffd78;
  uint64_t *in_stack_fffffffffffffd80;
  char_range *local_270;
  plain_fkhash_nlm<int> *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  plain_fkhash_nlm<int> *in_stack_fffffffffffffdb0;
  uint64_t local_228 [21];
  uint64_t in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe8c;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
  *in_stack_fffffffffffffe90;
  char_range local_18;
  value_type_conflict7 *local_8;
  
  local_18.begin = in_RSI;
  local_18.end = in_RDX;
  bVar2 = char_range::empty(&local_18);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->is_ready_);
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  if (local_18.end[-1] != '\0') {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->is_ready_);
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  uVar4 = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::size(&in_RDI->hash_trie_);
  if (uVar4 == 0) {
    if (((ulong)(((compact_vector *)&in_RDI->is_ready_)->chunks_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start & 1) == 0) {
      map(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
      operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      ~map(in_stack_fffffffffffffd60);
    }
    in_RDI->size_ = in_RDI->size_ + 1;
    plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::add_root(&in_RDI->hash_trie_);
    local_8 = plain_fkhash_nlm<int>::append(in_stack_fffffffffffffda0,local_270);
  }
  else {
    local_228[0] = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::get_root(&in_RDI->hash_trie_)
    ;
    while (bVar2 = char_range::empty(&local_18), ((bVar2 ^ 0xffU) & 1) != 0) {
      plain_fkhash_nlm<int>::compare
                (in_stack_fffffffffffffdb0,
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (char_range *)in_stack_fffffffffffffda0);
      ppiVar5 = std::get<0ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x21b1ee)
      ;
      ptVar6 = std::get<1ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x21b1fd);
      if (*ppiVar5 != (type)0x0) {
        return *ppiVar5;
      }
      local_18.begin = local_18.begin + *ptVar6;
      while ((pointer)in_RDI->lambda_ <= (pointer)*ptVar6) {
        bVar2 = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::add_child
                          ((plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *)in_RDI,
                           in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        if (bVar2) {
          expand_if_needed_(in_RDI,local_228);
          plain_fkhash_nlm<int>::append_dummy((plain_fkhash_nlm<int> *)in_stack_fffffffffffffd60);
        }
        *ptVar6 = *ptVar6 - (long)in_RDI->lambda_;
      }
      pvVar7 = std::array<unsigned_char,_256UL>::operator[]
                         ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffd60,
                          (size_type)in_stack_fffffffffffffd58);
      if (*pvVar7 == 0xff) {
        uVar1 = in_RDI->num_codes_;
        in_RDI->num_codes_ = uVar1 + 1;
        pvVar7 = std::array<unsigned_char,_256UL>::operator[]
                           ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffd60,
                            (size_type)in_stack_fffffffffffffd58);
        *pvVar7 = (value_type_conflict3)uVar1;
        in_stack_fffffffffffffdaf = 0;
        if (in_RDI->num_codes_ == 0xff) {
          uVar3 = __cxa_allocate_exception(0x10);
          exception::exception
                    ((exception *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->is_ready_);
          __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
        }
      }
      in_stack_fffffffffffffd60 =
           (map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
            *)&in_RDI->hash_trie_;
      make_symb_(in_stack_fffffffffffffd60,(uint8_t)((ulong)in_stack_fffffffffffffd58 >> 0x38),
                 0x21b3c9);
      bVar2 = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::add_child
                        ((plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *)in_RDI,
                         in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if (bVar2) {
        expand_if_needed_(in_RDI,local_228);
        local_18.begin = local_18.begin + 1;
        in_RDI->size_ = in_RDI->size_ + 1;
        pvVar8 = plain_fkhash_nlm<int>::append(in_stack_fffffffffffffda0,local_270);
        return pvVar8;
      }
      local_18.begin = local_18.begin + 1;
    }
    pVar9 = plain_fkhash_nlm<int>::compare
                      (in_stack_fffffffffffffdb0,
                       CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                       (char_range *)in_stack_fffffffffffffda0);
    local_270 = (char_range *)pVar9.first;
    local_8 = (value_type_conflict7 *)local_270;
    if (local_270 == (char_range *)0x0) {
      local_8 = (value_type_conflict7 *)0x0;
    }
  }
  return local_8;
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }